

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  pointer *ppvVar3;
  reference pbVar4;
  iterator __first;
  iterator __last;
  mapped_type *pmVar5;
  reference pvVar6;
  reference pvVar7;
  undefined1 local_750 [8];
  value_type c3d_data;
  iterator iStack_6d0;
  Sint16 cpi;
  undefined1 local_6c8 [8];
  value_type reference_data;
  Sint16 pi;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_638;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  elem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> marker_name;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_5e8 [8];
  C3DFile reference_file;
  C3DFile c3dfile;
  char *xsens_c3d;
  char *reference;
  char **argv_local;
  int argc_local;
  
  c3dfile._728_8_ = anon_var_dwarf_8f0f;
  C3DFile::C3DFile((C3DFile *)&reference_file.uses_integer_data);
  C3DFile::C3DFile((C3DFile *)local_5e8);
  C3DFile::load((C3DFile *)local_5e8,"../data/slackline0000_all_written.c3d");
  C3DFile::load((C3DFile *)&reference_file.uses_integer_data,(char *)c3dfile._728_8_);
  poVar2 = std::operator<<((ostream *)&std::cout,"Value Name");
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = std::operator<<(poVar2,"Original");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Reference");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Header first");
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)reference_file.uses_integer_data);
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)local_5e8[0]);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Header id");
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)(byte)reference_file._729_1_);
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)local_5e8[1]);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Header Num Mark");
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)(ushort)reference_file._730_2_);
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)(ushort)local_5e8._2_2_);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Header Ana Chan");
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)(ushort)reference_file._732_2_);
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)(ushort)local_5e8._4_2_);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Header 1. frame");
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)(ushort)reference_file._734_2_);
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)(ushort)local_5e8._6_2_);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Header last frame");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)(ushort)c3dfile.header._0_2_);
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)(ushort)reference_file.header._0_2_);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Header max int gap");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)c3dfile.header.num_markers);
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)reference_file.header.num_markers);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Header scale_factor");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)c3dfile.header._4_4_);
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)reference_file.header._4_4_);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Header start rec");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)c3dfile.header.last_frame);
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)reference_file.header.last_frame);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Header ana cha sam");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)c3dfile.header.max_interpolation_gap);
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(uint)reference_file.header.max_interpolation_gap);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Header vid sam ra");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,c3dfile.header.scale_factor);
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,reference_file.header.scale_factor);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Header key val la");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)c3dfile.header.reserved_1[0x83]);
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)reference_file.header.reserved_1[0x83]);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Header bl lab strt");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)c3dfile.header.reserved_1[0x84]);
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)reference_file.header.reserved_1[0x84]);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Header 4 events");
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)c3dfile.header.reserved_1[0x85]);
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)reference_file.header.reserved_1[0x85]);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Header num evnt");
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)c3dfile.header.reserved_1[0x86]);
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)reference_file.header.reserved_1[0x86]);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"Marker_name");
  poVar2 = std::operator<<(poVar2,"\tLoaded Values");
  poVar2 = std::operator<<(poVar2,"\tReference Values");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  ppvVar3 = &reference_file.point_data.
             super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)ppvVar3);
  marker_name.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ppvVar3);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&marker_name.field_2 + 8));
    if (!bVar1) break;
    pbVar4 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string((string *)&elem,(string *)pbVar4);
    ppvVar3 = &c3dfile.point_data.
               super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)ppvVar3);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)ppvVar3);
    local_638 = std::
                find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                          (__first._M_current,__last._M_current,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &elem);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                           *)&reference_file.point_label.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(key_type *)&elem);
    reference_data.residual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ = *pmVar5;
    pvVar6 = std::vector<FloatMarkerData,_std::allocator<FloatMarkerData>_>::operator[]
                       ((vector<FloatMarkerData,_std::allocator<FloatMarkerData>_> *)
                        &reference_file.label_point_map._M_t._M_impl.super__Rb_tree_header.
                         _M_node_count,
                        (long)reference_data.residual.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_);
    FloatMarkerData::FloatMarkerData((FloatMarkerData *)local_6c8,pvVar6);
    iStack_6d0 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&c3dfile.point_data.
                           super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = __gnu_cxx::operator!=(&local_638,&stack0xfffffffffffff930);
    if (bVar1) {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                             *)&c3dfile.point_label.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(key_type *)&elem
                           );
      c3d_data.residual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_2_ = *pmVar5;
      pvVar6 = std::vector<FloatMarkerData,_std::allocator<FloatMarkerData>_>::operator[]
                         ((vector<FloatMarkerData,_std::allocator<FloatMarkerData>_> *)
                          &c3dfile.label_point_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (long)reference_data.residual.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_);
      FloatMarkerData::FloatMarkerData((FloatMarkerData *)local_750,pvVar6);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "------------------------------------------------------------------------------"
                              );
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"\t\t");
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_750,0);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar7);
      poVar2 = std::operator<<(poVar2,"\t");
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_6c8,0);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar7);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&elem);
      poVar2 = std::operator<<(poVar2,"\t");
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &c3d_data.x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,0);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar7);
      poVar2 = std::operator<<(poVar2,"\t");
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &reference_data.x.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar7);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"\t\t");
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &c3d_data.y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,0);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar7);
      poVar2 = std::operator<<(poVar2,"\t");
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &reference_data.y.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar7);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "------------------------------------------------------------------------------"
                              );
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      FloatMarkerData::~FloatMarkerData((FloatMarkerData *)local_750);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"Dafug Happend ");
      poVar2 = std::operator<<(poVar2,(string *)&elem);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    FloatMarkerData::~FloatMarkerData((FloatMarkerData *)local_6c8);
    std::__cxx11::string::~string((string *)&elem);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  C3DFile::~C3DFile((C3DFile *)local_5e8);
  C3DFile::~C3DFile((C3DFile *)&reference_file.uses_integer_data);
  return 0;
}

Assistant:

int main (int argc, char *argv[])
{
	const char* reference = "../data/slackline0000_all_written.c3d";
	const char* xsens_c3d = "../data/slackline0000_all.c3d";
	C3DFile c3dfile, reference_file;
	reference_file.load (reference);
	c3dfile.load (xsens_c3d);
	

	cout << "Value Name" << "\t\t" << "Original" << "\t" << "Reference" << endl;
	//compare header
	cout << "Header first" << "\t\t" << (int)c3dfile.header.first_parameter << "\t\t" << (int)reference_file.header.first_parameter << endl;
	cout << "Header id" << "\t\t" << (int)c3dfile.header.c3d_id<< "\t\t" << (int)reference_file.header.c3d_id<< endl;
	cout << "Header Num Mark" << "\t\t" << (int)c3dfile.header.num_markers<< "\t\t" << (int)reference_file.header.num_markers<< endl;
	cout << "Header Ana Chan" << "\t\t" << (int)c3dfile.header.analog_channels<< "\t\t" << (int)reference_file.header.analog_channels<< endl;
	cout << "Header 1. frame" << "\t\t" << (int)c3dfile.header.first_frame<< "\t\t" << (int)reference_file.header.first_frame<< endl;
	cout << "Header last frame" << "\t" << (int)c3dfile.header.last_frame<< "\t\t" << (int)reference_file.header.last_frame<< endl;
	cout << "Header max int gap" << "\t" << (int)c3dfile.header.max_interpolation_gap<< "\t\t" << (int)reference_file.header.max_interpolation_gap<< endl;
	cout << "Header scale_factor" << "\t" << (float)c3dfile.header.scale_factor<< "\t\t" << (float)reference_file.header.scale_factor<< endl;
	cout << "Header start rec" << "\t" << (int)c3dfile.header.start_record<< "\t\t" << (int)reference_file.header.start_record<< endl;
	cout << "Header ana cha sam" << "\t" << (int)c3dfile.header.analog_channels_samples<< "\t\t" << (int)reference_file.header.analog_channels_samples<< endl;
	cout << "Header vid sam ra" << "\t" << (float)c3dfile.header.video_sampling_rate<< "\t\t" << (float)reference_file.header.video_sampling_rate<< endl;
	cout << "Header key val la" << "\t" << (int)c3dfile.header.key_value_label<< "\t\t" << (int)reference_file.header.key_value_label<< endl;
	cout << "Header bl lab strt" << "\t" << (int)c3dfile.header.block_label_start<< "\t\t" << (int)reference_file.header.block_label_start<< endl;
	cout << "Header 4 events" << "\t\t" << (int)c3dfile.header.key_value_char_4_events<< "\t\t" << (int)reference_file.header.key_value_char_4_events<< endl;
	cout << "Header num evnt" << "\t\t" << (int)c3dfile.header.num_events<< "\t\t" << (int)reference_file.header.num_events<< endl;

	cout << endl << "Marker_name" << "\tLoaded Values" << "\tReference Values" << endl;

	for (auto marker_name : reference_file.point_label) {
		auto elem = find(c3dfile.point_label.begin(), c3dfile.point_label.end(), marker_name);
		Sint16 pi = reference_file.label_point_map[marker_name];
		auto reference_data = reference_file.float_point_data[pi];
		if( elem != c3dfile.point_label.end() ) {
			Sint16 cpi = c3dfile.label_point_map[marker_name];
			auto c3d_data = c3dfile.float_point_data[pi];
			cout << "------------------------------------------------------------------------------" << endl;
			cout << "\t\t"<< c3d_data.x[0] << "\t" << reference_data.x[0] << endl;
			cout << marker_name << "\t" << c3d_data.y[0] << "\t" << reference_data.y[0] << endl;
			cout << "\t\t"<< c3d_data.z[0] << "\t" << reference_data.z[0] << endl;
			cout << "------------------------------------------------------------------------------" << endl;
		} else {
			cout << "Dafug Happend "<< marker_name << endl;
		}
	}


	return 0;
}